

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O0

acmod_id_t * mk_phone_list(char **btw_mark,uint32 *n_phone,char **word,uint32 n_word,lexicon_t *lex)

{
  lex_entry_t *plVar1;
  char *pcVar2;
  acmod_id_t *p;
  uint local_58;
  uint k;
  uint j;
  uint i;
  char *btw;
  lex_entry_t *e;
  uint32 n_p;
  lexicon_t *lex_local;
  uint32 n_word_local;
  char **word_local;
  uint32 *n_phone_local;
  char **btw_mark_local;
  
  if (n_word == 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
            ,0xa8,"Word sequence is empty\n");
    btw_mark_local = (char **)0x0;
  }
  else {
    e._4_4_ = 0;
    for (k = 0; k < n_word; k = k + 1) {
      plVar1 = lexicon_lookup(lex,word[k]);
      if (plVar1 == (lex_entry_t *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                ,0xb2,"Unable to lookup word \'%s\' in the dictionary\n",word[k]);
        return (acmod_id_t *)0x0;
      }
      e._4_4_ = plVar1->phone_cnt + e._4_4_;
    }
    btw_mark_local =
         (char **)__ckd_calloc__((ulong)e._4_4_,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                                 ,0xbc);
    pcVar2 = (char *)__ckd_calloc__((ulong)e._4_4_,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                                    ,0xc1);
    p._4_4_ = 0;
    for (k = 0; k < n_word; k = k + 1) {
      plVar1 = lexicon_lookup(lex,word[k]);
      if (plVar1->phone_cnt != 0) {
        for (local_58 = 0; local_58 < plVar1->phone_cnt - 1; local_58 = local_58 + 1) {
          *(acmod_id_t *)((long)btw_mark_local + (ulong)p._4_4_ * 4) = plVar1->ci_acmod_id[local_58]
          ;
          p._4_4_ = p._4_4_ + 1;
        }
        *(acmod_id_t *)((long)btw_mark_local + (ulong)p._4_4_ * 4) = plVar1->ci_acmod_id[local_58];
        pcVar2[p._4_4_] = '\x01';
        p._4_4_ = p._4_4_ + 1;
      }
    }
    *btw_mark = pcVar2;
    *n_phone = e._4_4_;
    if (p._4_4_ != e._4_4_) {
      __assert_fail("k == n_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                    ,0xd5,
                    "acmod_id_t *mk_phone_list(char **, uint32 *, char **, uint32, lexicon_t *)");
    }
  }
  return (acmod_id_t *)btw_mark_local;
}

Assistant:

acmod_id_t *mk_phone_list(char **btw_mark,
			  uint32 *n_phone,
			  char **word,
			  uint32 n_word,
			  lexicon_t *lex)
{
    uint32 n_p;
    lex_entry_t *e;
    char *btw;
    unsigned int i, j, k;
    acmod_id_t *p;

    if (n_word == 0) {
	E_WARN("Word sequence is empty\n");
	return NULL;
    }

    /*
     * Determine the # of phones in the sequence.
     */
    for (i = 0, n_p = 0; i < n_word; i++) {
	e = lexicon_lookup(lex, word[i]);
	if (e == NULL) {
	    E_WARN("Unable to lookup word '%s' in the dictionary\n", word[i]);

	    return NULL;
	}
	n_p += e->phone_cnt;
    }

    /*
     * Allocate the phone sequence
     */
    p = ckd_calloc(n_p, sizeof(acmod_id_t));

    /*
     * Allocate the between word markers
     */
    btw = ckd_calloc(n_p, sizeof(char));

    for (i = 0, k = 0; i < n_word; i++) {	/* for each word */
	e = lexicon_lookup(lex, word[i]);
	if (e->phone_cnt == 0) /* Ignore words with no pronunciation */
	  continue;
	for (j = 0; j < e->phone_cnt-1; j++, k++) {	/* for all but the last phone in the word */
	    p[k] = e->ci_acmod_id[j];
	}
	p[k] = e->ci_acmod_id[j];	/* move over the last phone */

	btw[k] = TRUE;			/* mark word boundary following
					   kth phone */

	++k;
    }

    *btw_mark = btw;
    *n_phone = n_p;

    assert(k == n_p);

    return p;
}